

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastErrorMessageCommaSeparated::Operation<duckdb::string_t,double>
          (TryCastErrorMessageCommaSeparated *this,string_t input,double *result,
          CastParameters *parameters)

{
  bool bVar1;
  char *buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  allocator local_81;
  string local_80;
  string local_60 [32];
  string local_40;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  buf = input_local.value.pointer.prefix;
  if (0xc < (uint)this) {
    buf = input_local.value.pointer.ptr;
  }
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)*(bool *)(result + 1);
  input_local.value._0_8_ = this;
  bVar1 = TryDoubleCast<double>
                    (buf,(ulong)this & 0xffffffff,input.value._8_8_,*(bool *)(result + 1),',');
  if (!bVar1) {
    ::std::__cxx11::string::string(local_60,"Could not cast string to double: \"%s\"",&local_81);
    string_t::GetString_abi_cxx11_(&local_80,&input_local);
    StringUtil::Format<std::__cxx11::string>(&local_40,(StringUtil *)local_60,&local_80,params);
    HandleCastError::AssignError(&local_40,(CastParameters *)result);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string(local_60);
  }
  return bVar1;
}

Assistant:

bool TryCastErrorMessageCommaSeparated::Operation(string_t input, double &result, CastParameters &parameters) {
	if (!TryDoubleCast<double>(input.GetData(), input.GetSize(), result, parameters.strict, ',')) {
		HandleCastError::AssignError(StringUtil::Format("Could not cast string to double: \"%s\"", input.GetString()),
		                             parameters);
		return false;
	}
	return true;
}